

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ThrowException(XFileParser *this,string *pText)

{
  bool bVar1;
  runtime_error *this_00;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  bVar1 = this->mIsBinaryFormat;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  if (bVar1 == true) {
    DeadlyImportError::DeadlyImportError((DeadlyImportError *)this_00,pText);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Line ",5);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(pText->_M_dataplus)._M_p,pText->_M_string_length);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1b8);
  *(undefined ***)this_00 = &PTR__runtime_error_00900168;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AI_WONT_RETURN void XFileParser::ThrowException( const std::string& pText) {
    if ( mIsBinaryFormat ) {
        throw DeadlyImportError( pText );
    } else {
        throw DeadlyImportError( format() << "Line " << mLineNumber << ": " << pText );
    }
}